

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cc
# Opt level: O2

bool __thiscall xLearn::Checker::check_train_param(Checker *this,HyperParam *hyper_param)

{
  string *psVar1;
  string *psVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Checker *this_00;
  Checker *pCVar6;
  Checker *pCVar7;
  string sStack_48;
  
  pCVar6 = (Checker *)&sStack_48;
  pCVar7 = (Checker *)&sStack_48;
  if (hyper_param->from_file == true) {
    bVar3 = FileExist((hyper_param->train_set_file)._M_dataplus._M_p);
    if (!bVar3) {
      StringPrintf_abi_cxx11_
                (&sStack_48,"Training data file: %s does not exist.",
                 (hyper_param->train_set_file)._M_dataplus._M_p);
      Color::print_error(&sStack_48);
      std::__cxx11::string::~string((string *)&sStack_48);
    }
    if (((hyper_param->validate_set_file)._M_string_length == 0) ||
       (bVar4 = FileExist((hyper_param->validate_set_file)._M_dataplus._M_p), bVar4))
    goto LAB_0015fedb;
    StringPrintf_abi_cxx11_
              (&sStack_48,"Validation data file: %s does not exist.",
               (hyper_param->validate_set_file)._M_dataplus._M_p);
    Color::print_error(&sStack_48);
  }
  else {
    bVar3 = true;
    if (hyper_param->train_dataset != (DMatrix *)0x0) goto LAB_0015fedb;
    StringPrintf_abi_cxx11_(&sStack_48,"Training dataset is None, please check!");
    Color::print_error(&sStack_48);
  }
  std::__cxx11::string::~string((string *)&sStack_48);
  bVar3 = false;
LAB_0015fedb:
  if (hyper_param->thread_number < 0) {
    StringPrintf_abi_cxx11_(&sStack_48,"The thread number must be greater than zero: %d.");
    Color::print_error(&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
    bVar3 = false;
  }
  iVar5 = std::__cxx11::string::compare((char *)&hyper_param->loss_func);
  if (iVar5 == 0) {
    StringPrintf_abi_cxx11_(&sStack_48,"The task can only be \'binary\' or \'reg\'.");
    Color::print_error(&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
    bVar3 = false;
  }
  psVar1 = &hyper_param->metric;
  iVar5 = std::__cxx11::string::compare((char *)psVar1);
  if ((((((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)psVar1), iVar5 != 0)) &&
        (iVar5 = std::__cxx11::string::compare((char *)psVar1), iVar5 != 0)) &&
       (((iVar5 = std::__cxx11::string::compare((char *)psVar1), iVar5 != 0 &&
         (iVar5 = std::__cxx11::string::compare((char *)psVar1), iVar5 != 0)) &&
        ((iVar5 = std::__cxx11::string::compare((char *)psVar1), iVar5 != 0 &&
         ((iVar5 = std::__cxx11::string::compare((char *)psVar1), iVar5 != 0 &&
          (iVar5 = std::__cxx11::string::compare((char *)psVar1), iVar5 != 0)))))))) &&
      (iVar5 = std::__cxx11::string::compare((char *)psVar1), iVar5 != 0)) &&
     (iVar5 = std::__cxx11::string::compare((char *)psVar1), iVar5 != 0)) {
    StringPrintf_abi_cxx11_(&sStack_48,"Unknow evaluation metric: %s.",(psVar1->_M_dataplus)._M_p);
    Color::print_error(&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
    bVar3 = false;
  }
  psVar2 = &hyper_param->opt_type;
  this_00 = (Checker *)psVar2;
  iVar5 = std::__cxx11::string::compare((char *)psVar2);
  if (((iVar5 != 0) &&
      (this_00 = (Checker *)psVar2, iVar5 = std::__cxx11::string::compare((char *)psVar2),
      iVar5 != 0)) &&
     (this_00 = (Checker *)psVar2, iVar5 = std::__cxx11::string::compare((char *)psVar2), iVar5 != 0
     )) {
    StringPrintf_abi_cxx11_(&sStack_48,"Unknow optimization method: %s.",(psVar2->_M_dataplus)._M_p)
    ;
    Color::print_error(&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
    bVar3 = false;
    this_00 = pCVar6;
  }
  if (999999 < hyper_param->num_K) {
    StringPrintf_abi_cxx11_
              (&sStack_48,"Invalid size of K: %d. Size of K must be greater than zero.");
    Color::print_error(&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
    bVar3 = false;
    this_00 = pCVar7;
  }
  if (hyper_param->num_folds < 1) {
    StringPrintf_abi_cxx11_
              (&sStack_48,"Invalid size of folds: %d. Size of folds must be greater than zero.");
    Color::print_error(&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
    if (0 < hyper_param->num_epoch) {
      return false;
    }
  }
  else if (0 < hyper_param->num_epoch) {
    if (bVar3 == false) {
      return false;
    }
    check_conflict_train(this_00,hyper_param);
    if (((hyper_param->model_file)._M_string_length == 0) &&
       (hyper_param->cross_validation == false)) {
      std::operator+(&sStack_48,&hyper_param->train_set_file,".model");
      std::__cxx11::string::operator=((string *)&hyper_param->model_file,(string *)&sStack_48);
      std::__cxx11::string::~string((string *)&sStack_48);
    }
    iVar5 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar5 == 0) {
      std::__cxx11::string::assign((char *)psVar1);
      return true;
    }
    return true;
  }
  StringPrintf_abi_cxx11_
            (&sStack_48,"Invalid number of epoch: %d. Number of epoch must be greater than zero.");
  Color::print_error(&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  return false;
}

Assistant:

bool Checker::check_train_param(HyperParam& hyper_param) {
  bool bo = true;
  /*********************************************************
   *  Check file path                                      *
   *********************************************************/
  if (hyper_param.from_file) {
    if (!FileExist(hyper_param.train_set_file.c_str())) {
      Color::print_error(
        StringPrintf("Training data file: %s does not exist.", 
                      hyper_param.train_set_file.c_str())
      );
      bo = false;
    }
    if (!hyper_param.validate_set_file.empty() &&
        !FileExist(hyper_param.validate_set_file.c_str())) {
      Color::print_error(
        StringPrintf("Validation data file: %s does not exist.", 
                      hyper_param.validate_set_file.c_str())
      );
      bo = false;
    }  
  } else {
    if (hyper_param.train_dataset == nullptr) {
      Color::print_error(
        StringPrintf("Training dataset is None, please check!")
      );
      bo = false;
    }
  }
  /*********************************************************
   *  Check invalid value                                  *
   *********************************************************/
  if (hyper_param.thread_number < 0) {
    Color::print_error(
      StringPrintf("The thread number must be greater than zero: %d.",
        hyper_param.thread_number)
    );
    bo = false;
  }
  if (hyper_param.loss_func.compare("unknow") == 0) {
    Color::print_error(
      StringPrintf("The task can only be 'binary' or 'reg'.")
    );
    bo = false;
  }
  if (hyper_param.metric.compare("acc") != 0 &&
      hyper_param.metric.compare("prec") != 0 &&
      hyper_param.metric.compare("recall") != 0 &&
      hyper_param.metric.compare("f1") != 0 &&
      hyper_param.metric.compare("auc") != 0 &&
      hyper_param.metric.compare("mae") != 0 &&
      hyper_param.metric.compare("mape") != 0 &&
      hyper_param.metric.compare("rmsd") != 0 &&
      hyper_param.metric.compare("rmse") != 0 &&
      hyper_param.metric.compare("none") != 0) {
    Color::print_error(
      StringPrintf("Unknow evaluation metric: %s.",
        hyper_param.metric.c_str())
    );
    bo = false;
  }
  if (hyper_param.opt_type.compare("sgd") != 0 &&
      hyper_param.opt_type.compare("ftrl") != 0 &&
      hyper_param.opt_type.compare("adagrad") != 0) {
    Color::print_error(
      StringPrintf("Unknow optimization method: %s.",
        hyper_param.opt_type.c_str())
    );
    bo = false;
  }
  if (hyper_param.num_K > 999999) {
    Color::print_error(
      StringPrintf("Invalid size of K: %d. "
                   "Size of K must be greater than zero.", 
        hyper_param.num_K)
    );
    bo = false;
  }
  if (hyper_param.num_folds <= 0) {
    Color::print_error(
      StringPrintf("Invalid size of folds: %d. "
                   "Size of folds must be greater than zero.", 
        hyper_param.num_folds)
    );
    bo = false;
  }
  if (hyper_param.num_epoch <= 0) {
    Color::print_error(
      StringPrintf("Invalid number of epoch: %d. "
                   "Number of epoch must be greater than zero.", 
        hyper_param.num_epoch)
    );
    bo = false;
  }
  if (!bo) return false;
  /*********************************************************
   *  Check warning and fix conflict                       *
   *********************************************************/
  check_conflict_train(hyper_param);
  /*********************************************************
   *  Set default value                                    *
   *********************************************************/
  if (hyper_param.model_file.empty() && !hyper_param.cross_validation) {
    hyper_param.model_file = hyper_param.train_set_file + ".model";
  }
  if (hyper_param.metric.compare("rmse") == 0) {
    hyper_param.metric = "rmsd";
  }

  return true;
}